

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O0

string * MeshLib::Trait::getTraitValue
                   (string *__return_storage_ptr__,string *traitString,string *traitName)

{
  string *psVar1;
  ostream *poVar2;
  string local_c8 [8];
  string isolatedTraitString;
  undefined1 local_a0 [4];
  int temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  undefined4 local_28;
  int sfp;
  int ep;
  int sp;
  string *traitName_local;
  string *traitString_local;
  
  _ep = traitName;
  traitName_local = traitString;
  traitString_local = __return_storage_ptr__;
  std::operator+(&local_70," ",traitName);
  std::operator+(&local_50,&local_70,"=(");
  local_2c = std::__cxx11::string::find((string *)traitString,(ulong)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  psVar1 = traitName_local;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,_ep,
                 "=(");
  sfp = std::__cxx11::string::find((string *)psVar1,(ulong)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  if ((sfp == 0) || (local_2c != -1)) {
    if (sfp == 0) {
      isolatedTraitString.field_2._12_4_ = sfp;
    }
    else {
      isolatedTraitString.field_2._12_4_ = local_2c;
    }
    std::__cxx11::string::substr((ulong)local_c8,(ulong)traitName_local);
    sfp = std::__cxx11::string::find_first_of((char *)local_c8,0x1333ad);
    local_28 = std::__cxx11::string::find_first_of((char *)local_c8,0x13334c);
    if (sfp == -1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: String missing parenthesis: ");
      poVar2 = std::operator<<(poVar2,local_c8);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      sfp = sfp + 1;
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_c8);
    }
    std::__cxx11::string::~string(local_c8);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Trait::getTraitValue(std::string &traitString, std::string &traitName)
{
	int sp, ep, sfp;
	sfp = (int)traitString.find(" "+traitName+"=(");
	sp = (int)traitString.find(traitName+"=(");
	if(sp == 0 || sfp != (int)std::string::npos)
	{
		int temp;
		if( sp == 0 ) temp = sp;
		else temp = sfp;

		std::string isolatedTraitString(traitString.substr(temp));
		sp = (int)isolatedTraitString.find_first_of("(");
		ep = (int)isolatedTraitString.find_first_of(")");
		if(sp != (int)std::string::npos)
		{
			// the value was found
			sp++;
			return isolatedTraitString.substr(sp, ep-sp);
		}
		else
		{
			std::cerr << "ERROR: String missing parenthesis: " << isolatedTraitString << std::endl;
			return std::string();
		}
	}

	return std::string();
}